

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

double __thiscall ON_PlaneEquation::MaximumValueAt(ON_PlaneEquation *this,ON_BoundingBox *bbox)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar4 = (bbox->m_min).x * this->x;
  dVar1 = this->x * (bbox->m_max).x;
  if (dVar4 <= dVar1) {
    dVar4 = dVar1;
  }
  dVar1 = (bbox->m_min).y * this->y;
  dVar2 = this->y * (bbox->m_max).y;
  if (dVar1 <= dVar2) {
    dVar1 = dVar2;
  }
  dVar2 = (bbox->m_min).z * this->z;
  dVar3 = this->z * (bbox->m_max).z;
  if (dVar2 <= dVar3) {
    dVar2 = dVar3;
  }
  return dVar2 + dVar1 + dVar4 + this->d;
}

Assistant:

double ON_PlaneEquation::MaximumValueAt(const ON_BoundingBox& bbox) const
{
  double xx, yy, zz, s;

  s = x*bbox.m_min.x;
  if ( s > (xx = x*bbox.m_max.x) ) xx = s;

  s = y*bbox.m_min.y;
  if ( s > (yy = y*bbox.m_max.y) ) yy = s;

  s = z*bbox.m_min.z;
  if ( s > (zz = z*bbox.m_max.z) ) zz = s;

  return (xx + yy + zz + d);
}